

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

uint32_t __thiscall spvtools::opt::InstrumentPass::GetVec4FloatId(InstrumentPass *this)

{
  uint32_t uVar1;
  TypeManager *this_00;
  Type *pTVar2;
  Float float_ty;
  Vector v4float_ty;
  
  if (this->v4float_id_ != 0) {
    return this->v4float_id_;
  }
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  float_ty.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  float_ty.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  float_ty.super_Type.decorations_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  float_ty.super_Type.kind_ = kFloat;
  float_ty.super_Type._36_4_ = 0x20;
  float_ty.super_Type._vptr_Type = (_func_int **)&PTR__Type_003b1af0;
  pTVar2 = analysis::TypeManager::GetRegisteredType(this_00,&float_ty.super_Type);
  analysis::Vector::Vector(&v4float_ty,pTVar2,4);
  pTVar2 = analysis::TypeManager::GetRegisteredType(this_00,&v4float_ty.super_Type);
  uVar1 = analysis::TypeManager::GetTypeInstruction(this_00,pTVar2);
  this->v4float_id_ = uVar1;
  analysis::Type::~Type(&v4float_ty.super_Type);
  analysis::Type::~Type(&float_ty.super_Type);
  return this->v4float_id_;
}

Assistant:

uint32_t InstrumentPass::GetVec4FloatId() {
  if (v4float_id_ == 0) {
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Float float_ty(32);
    analysis::Type* reg_float_ty = type_mgr->GetRegisteredType(&float_ty);
    analysis::Vector v4float_ty(reg_float_ty, 4);
    analysis::Type* reg_v4float_ty = type_mgr->GetRegisteredType(&v4float_ty);
    v4float_id_ = type_mgr->GetTypeInstruction(reg_v4float_ty);
  }
  return v4float_id_;
}